

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O2

void __thiscall MsFlash50::MsFlash50(MsFlash50 *this,ByteVector *data)

{
  uint uVar1;
  uint uVar2;
  pointer puVar3;
  ulong uVar4;
  long lVar5;
  bool bVar6;
  extra local_58;
  
  (this->_regionlist).super__Vector_base<MsFlash50::region,_std::allocator<MsFlash50::region>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_regionlist).super__Vector_base<MsFlash50::region,_std::allocator<MsFlash50::region>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_extralist).super__Vector_base<MsFlash50::extra,_std::allocator<MsFlash50::extra>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_regionlist).super__Vector_base<MsFlash50::region,_std::allocator<MsFlash50::region>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_extralist).super__Vector_base<MsFlash50::extra,_std::allocator<MsFlash50::extra>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_extralist).super__Vector_base<MsFlash50::extra,_std::allocator<MsFlash50::extra>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  puVar3 = (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar1 = *(uint *)(puVar3 + 8);
  uVar2 = *(uint *)(puVar3 + 0xc);
  for (uVar4 = 0; (uVar1 & 0xfffffff0) != uVar4; uVar4 = uVar4 + 0x10) {
    extra::extra(&local_58,
                 (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_start + uVar4 + 0x10);
    std::vector<MsFlash50::extra,_std::allocator<MsFlash50::extra>_>::emplace_back<MsFlash50::extra>
              (&this->_extralist,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
  }
  uVar4 = (ulong)(uVar2 / 0x1c);
  lVar5 = ((long)(int)uVar1 & 0xfffffffffffffff0U) + 0x28;
  while (bVar6 = uVar4 != 0, uVar4 = uVar4 - 1, bVar6) {
    puVar3 = (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    local_58.name._M_dataplus._M_p._0_4_ = *(undefined4 *)(puVar3 + lVar5 + -0x18);
    local_58.name._M_dataplus._M_p._4_4_ = *(undefined4 *)(puVar3 + lVar5 + -0x14);
    local_58.name._M_string_length._0_4_ = *(undefined4 *)(puVar3 + lVar5 + -0x10);
    local_58.name._M_string_length._4_4_ = *(undefined4 *)(puVar3 + lVar5 + -0xc);
    local_58.name.field_2._M_allocated_capacity._0_4_ = *(undefined4 *)(puVar3 + lVar5 + -8);
    local_58.name.field_2._M_allocated_capacity._4_4_ = *(undefined4 *)(puVar3 + lVar5 + -4);
    local_58.name.field_2._8_4_ = *(undefined4 *)(puVar3 + lVar5);
    std::vector<MsFlash50::region,_std::allocator<MsFlash50::region>_>::
    emplace_back<MsFlash50::region>(&this->_regionlist,(region *)&local_58);
    lVar5 = lVar5 + 0x1c;
  }
  if (g_verbose != 0) {
    puts("MSFLSH50");
    std::
    for_each<__gnu_cxx::__normal_iterator<MsFlash50::extra*,std::vector<MsFlash50::extra,std::allocator<MsFlash50::extra>>>,MsFlash50::__normal_iterator(std::vector<unsigned_char,std::allocator<unsigned_char>>const&)::_lambda(MsFlash50::extra_const&)_1_>
              ((this->_extralist).
               super__Vector_base<MsFlash50::extra,_std::allocator<MsFlash50::extra>_>._M_impl.
               super__Vector_impl_data._M_start,
               (this->_extralist).
               super__Vector_base<MsFlash50::extra,_std::allocator<MsFlash50::extra>_>._M_impl.
               super__Vector_impl_data._M_finish);
    std::
    for_each<__gnu_cxx::__normal_iterator<MsFlash50::region*,std::vector<MsFlash50::region,std::allocator<MsFlash50::region>>>,MsFlash50::__normal_iterator(std::vector<unsigned_char,std::allocator<unsigned_char>>const&)::_lambda(MsFlash50::region_const&)_1_>
              ((this->_regionlist).
               super__Vector_base<MsFlash50::region,_std::allocator<MsFlash50::region>_>._M_impl.
               super__Vector_impl_data._M_start,
               (this->_regionlist).
               super__Vector_base<MsFlash50::region,_std::allocator<MsFlash50::region>_>._M_impl.
               super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

MsFlash50(const ByteVector& data)
    {
        int extracount= get32le(&data[8])/0x10;
        int regioncount= get32le(&data[12])/0x1C;

        for (int i=0 ; i<extracount ; i++)
            _extralist.push_back(extra(&data[16+16*i]));
        for (int i=0 ; i<regioncount ; i++)
            _regionlist.push_back(region(&data[16+16*extracount+0x1c*i]));

        if (g_verbose) {
            printf("MSFLSH50\n");
            std::for_each(_extralist.begin(), _extralist.end(), [](const extra& e) { e.print(); });
            std::for_each(_regionlist.begin(), _regionlist.end(), [](const region& r) { r.print(); });
        }
    }